

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

optional<bool>
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode,
          byte key_byte,basic_art_key<unsigned_long> k,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance,
          read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  atomic<long> *paVar1;
  atomic<unsigned_long> *paVar2;
  long lVar3;
  ulong uVar4;
  write_guard ptr_;
  bool bVar5;
  ushort uVar6;
  uintptr_t uVar7;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar8;
  ushort uVar9;
  optimistic_lock *poVar10;
  find_result fVar11;
  __atomic_base<unsigned_long> local_60;
  write_guard node_guard;
  id local_50;
  write_guard child_guard_1;
  write_guard node_guard_1;
  write_guard child_guard;
  
  fVar11 = basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
           ::find_child(&inode->
                         super_olc_inode_16_parent<unsigned_long,_std::span<const_std::byte>_>,
                        key_byte);
  piVar8 = fVar11.second;
  if (piVar8 == (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                 *)0x0) {
    poVar10 = parent_critical_section->lock;
    if ((poVar10->read_lock_count).super___atomic_base<long>._M_i < 1) {
LAB_0014e5bc:
      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
    }
    if ((parent_critical_section->version).version !=
        (poVar10->version).version.super___atomic_base<unsigned_long>._M_i) goto LAB_0014e4b2;
    LOCK();
    paVar1 = &poVar10->read_lock_count;
    lVar3 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
LAB_0014e5db:
      __assert_fail("old_value > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
    }
    parent_critical_section->lock = (optimistic_lock *)0x0;
    poVar10 = node_critical_section->lock;
    if ((poVar10->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0014e5bc;
    if ((node_critical_section->version).version ==
        (poVar10->version).version.super___atomic_base<unsigned_long>._M_i) {
      LOCK();
      paVar1 = &poVar10->read_lock_count;
      lVar3 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_0014e5db;
      node_critical_section->lock = (optimistic_lock *)0x0;
LAB_0014e495:
      uVar9 = 0x100;
      uVar6 = 0;
      goto LAB_0014e49b;
    }
    optimistic_lock::dec_read_lock_count(poVar10);
    node_critical_section->lock = (optimistic_lock *)0x0;
  }
  else {
    child->tagged_ptr = (piVar8->value)._M_i.tagged_ptr;
    bVar5 = optimistic_lock::read_critical_section::check(node_critical_section);
    if (bVar5) {
      optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffffa0);
      child_critical_section->lock = (optimistic_lock *)local_60._M_i;
      local_60._M_i = 0;
      (child_critical_section->version).version = (version_tag_type)node_guard.lock;
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&stack0xffffffffffffffa0);
      if (child_critical_section->lock != (optimistic_lock *)0x0) {
        uVar4 = child->tagged_ptr;
        *child_type = (node_type)uVar4 & (I256|I48);
        if ((uVar4 & 7) == 0) {
          bVar5 = basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::matches
                            ((basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                             (uVar4 & 0xfffffffffffffff8),(art_key_type)k.field_0);
          if (bVar5) {
            if ((inode->super_olc_inode_16_parent<unsigned_long,_std::span<const_std::byte>_>).
                super_basic_inode_16_parent<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                .
                super_basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                .children_count.value.super___atomic_base<unsigned_char>._M_i != '\x05') {
              poVar10 = parent_critical_section->lock;
              if ((poVar10->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0014e5bc;
              if ((parent_critical_section->version).version ==
                  (poVar10->version).version.super___atomic_base<unsigned_long>._M_i) {
                LOCK();
                paVar1 = &poVar10->read_lock_count;
                lVar3 = (paVar1->super___atomic_base<long>)._M_i;
                (paVar1->super___atomic_base<long>)._M_i =
                     (paVar1->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                goto LAB_0014e5db;
                parent_critical_section->lock = (optimistic_lock *)0x0;
                local_60._M_i =
                     (__int_type)
                     optimistic_lock::write_guard::try_lock_upgrade(node_critical_section);
                if ((optimistic_lock *)local_60._M_i == (optimistic_lock *)0x0) {
                  uVar9 = 0;
                }
                else {
                  node_guard_1.lock =
                       optimistic_lock::write_guard::try_lock_upgrade(child_critical_section);
                  if (node_guard_1.lock == (optimistic_lock *)0x0) {
                    uVar9 = 0;
                    node_guard_1.lock = (optimistic_lock *)0x0;
                  }
                  else {
                    optimistic_lock::write_unlock_and_obsolete(node_guard_1.lock);
                    node_guard_1.lock = (optimistic_lock *)0x0;
                    olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                    ::remove(inode,(char *)(ulong)fVar11.first);
                    *child_in_parent =
                         (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                          *)0x0;
                    uVar9 = 0x100;
                  }
                  optimistic_lock::write_guard::~write_guard(&node_guard_1);
                }
                optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffffa0);
                goto LAB_0014e3ff;
              }
              goto LAB_0014e4b2;
            }
            basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
            ::
            make_db_inode_unique_ptr<unodb::detail::olc_inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&>
                      ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                        *)&stack0xffffffffffffffa0,db_instance,inode);
            node_guard_1.lock =
                 optimistic_lock::write_guard::try_lock_upgrade(parent_critical_section);
            if (node_guard_1.lock != (optimistic_lock *)0x0) {
              child_guard_1.lock =
                   optimistic_lock::write_guard::try_lock_upgrade(node_critical_section);
              if (child_guard_1.lock != (optimistic_lock *)0x0) {
                local_50._M_thread =
                     (native_handle_type)
                     optimistic_lock::write_guard::try_lock_upgrade(child_critical_section);
                if ((optimistic_lock *)local_50._M_thread != (optimistic_lock *)0x0) {
                  olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                  init((olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                        *)node_guard.lock,(EVP_PKEY_CTX *)db_instance);
                  ptr_ = node_guard;
                  node_guard.lock = (optimistic_lock *)0x0;
                  uVar7 = basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr
                                    ((olc_node_header *)ptr_.lock,I4);
                  (node_in_parent->value)._M_i.tagged_ptr = uVar7;
                  if (child_guard_1.lock != (optimistic_lock *)0x0) {
                    __assert_fail("!node_guard.active()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                  ,0x644,
                                  "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_16<unsigned long, std::span<const std::byte>>]"
                                 );
                  }
                  if ((optimistic_lock *)local_50._M_thread != (optimistic_lock *)0x0) {
                    __assert_fail("!child_guard.active()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                  ,0x645,
                                  "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_16<unsigned long, std::span<const std::byte>>]"
                                 );
                  }
                  *child_in_parent =
                       (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                        *)0x0;
                  optimistic_lock::write_guard::~write_guard
                            ((write_guard *)&stack0xffffffffffffffb0);
                  optimistic_lock::write_guard::~write_guard(&child_guard_1);
                  optimistic_lock::write_guard::~write_guard(&node_guard_1);
                  std::
                  unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                 *)&stack0xffffffffffffffa0);
                  LOCK();
                  paVar2 = (db_instance->shrinking_inode_counts)._M_elems + 1;
                  (paVar2->super___atomic_base<unsigned_long>)._M_i =
                       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
                  UNLOCK();
                  goto LAB_0014e2d9;
                }
                optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffffb0);
              }
              optimistic_lock::write_guard::~write_guard(&child_guard_1);
            }
            optimistic_lock::write_guard::~write_guard(&node_guard_1);
            std::
            unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                           *)&stack0xffffffffffffffa0);
          }
          else {
            poVar10 = parent_critical_section->lock;
            if ((poVar10->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0014e5bc;
            if ((parent_critical_section->version).version !=
                (poVar10->version).version.super___atomic_base<unsigned_long>._M_i)
            goto LAB_0014e4b2;
            LOCK();
            paVar1 = &poVar10->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_0014e5db;
            parent_critical_section->lock = (optimistic_lock *)0x0;
            poVar10 = node_critical_section->lock;
            if ((poVar10->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0014e5bc;
            if ((node_critical_section->version).version ==
                (poVar10->version).version.super___atomic_base<unsigned_long>._M_i) {
              LOCK();
              paVar1 = &poVar10->read_lock_count;
              lVar3 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
              goto LAB_0014e5db;
              node_critical_section->lock = (optimistic_lock *)0x0;
              poVar10 = child_critical_section->lock;
              if ((poVar10->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0014e5bc;
              node_critical_section = child_critical_section;
              if ((child_critical_section->version).version ==
                  (poVar10->version).version.super___atomic_base<unsigned_long>._M_i) {
                LOCK();
                paVar1 = &poVar10->read_lock_count;
                lVar3 = (paVar1->super___atomic_base<long>)._M_i;
                (paVar1->super___atomic_base<long>)._M_i =
                     (paVar1->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                goto LAB_0014e5db;
                child_critical_section->lock = (optimistic_lock *)0x0;
                goto LAB_0014e495;
              }
            }
            optimistic_lock::dec_read_lock_count(poVar10);
            node_critical_section->lock = (optimistic_lock *)0x0;
          }
        }
        else {
          *child_in_parent = piVar8;
          poVar10 = parent_critical_section->lock;
          if ((poVar10->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0014e5bc;
          if ((parent_critical_section->version).version ==
              (poVar10->version).version.super___atomic_base<unsigned_long>._M_i) {
            LOCK();
            paVar1 = &poVar10->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_0014e5db;
            parent_critical_section->lock = (optimistic_lock *)0x0;
LAB_0014e2d9:
            uVar9 = 0x100;
LAB_0014e3ff:
            uVar6 = 1;
            goto LAB_0014e49b;
          }
LAB_0014e4b2:
          optimistic_lock::dec_read_lock_count(poVar10);
          parent_critical_section->lock = (optimistic_lock *)0x0;
        }
      }
    }
  }
  uVar6 = 0;
  uVar9 = 0;
LAB_0014e49b:
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar9 | uVar6);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}